

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::WriteFramesLessThan(Segment *this,uint64_t timestamp)

{
  uint uVar1;
  Cluster *this_00;
  Frame *frame;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int32_t i;
  long lVar7;
  
  iVar3 = this->frames_size_;
  uVar6 = 1;
  if ((0 < iVar3) && (0 < (long)this->cluster_list_size_)) {
    if ((this->frames_ == (Frame **)0x0) ||
       (this_00 = this->cluster_list_[(long)this->cluster_list_size_ + -1],
       this_00 == (Cluster *)0x0)) {
      uVar6 = 0;
    }
    else {
      uVar1 = 0;
      lVar7 = 1;
      while ((lVar7 < iVar3 && (this->frames_[lVar7]->timestamp_ <= timestamp))) {
        frame = this->frames_[lVar7 + -1];
        if (frame->discard_padding_ != 0) {
          this->doc_type_version_ = 4;
        }
        bVar2 = Cluster::QueueOrWriteFrame(this_00,frame);
        if ((bVar2) &&
           (((this->new_cuepoint_ != true || (this->cues_track_ != frame->track_number_)) ||
            (bVar2 = AddCuePoint(this,frame->timestamp_,this->cues_track_), bVar2)))) {
          uVar1 = uVar1 + 1;
          uVar5 = frame->timestamp_;
          if (this->last_timestamp_ < uVar5) {
            this->last_timestamp_ = uVar5;
            this->last_track_timestamp_[frame->track_number_ - 1] = uVar5;
          }
        }
        Frame::~Frame(frame);
        operator_delete(frame);
        lVar7 = lVar7 + 1;
        iVar3 = this->frames_size_;
      }
      if (0 < (int)uVar1) {
        uVar6 = 0;
        uVar4 = iVar3 - uVar1;
        if (uVar4 != 0 && (int)uVar1 <= iVar3) {
          uVar5 = 0;
          if (0 < (int)uVar4) {
            uVar5 = (ulong)uVar4;
          }
          for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            this->frames_[uVar6] = this->frames_[uVar6 + uVar1];
          }
          this->frames_size_ = uVar4;
          uVar6 = 1;
        }
      }
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

bool Segment::WriteFramesLessThan(uint64_t timestamp) {
  // Check |cluster_list_size_| to see if this is the first cluster. If it is
  // the first cluster the audio frames that are less than the first video
  // timesatmp will be written in a later step.
  if (frames_size_ > 0 && cluster_list_size_ > 0) {
    if (!frames_)
      return false;

    Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
    if (!cluster)
      return false;

    int32_t shift_left = 0;

    // TODO(fgalligan): Change this to use the durations of frames instead of
    // the next frame's start time if the duration is accurate.
    for (int32_t i = 1; i < frames_size_; ++i) {
      const Frame* const frame_curr = frames_[i];

      if (frame_curr->timestamp() > timestamp)
        break;

      const Frame* const frame_prev = frames_[i - 1];
      if (frame_prev->discard_padding() != 0)
        doc_type_version_ = 4;
      if (!cluster->AddFrame(frame_prev)) {
        delete frame_prev;
        continue;
      }

      if (new_cuepoint_ && cues_track_ == frame_prev->track_number()) {
        if (!AddCuePoint(frame_prev->timestamp(), cues_track_)) {
          delete frame_prev;
          continue;
        }
      }

      ++shift_left;
      if (frame_prev->timestamp() > last_timestamp_) {
        last_timestamp_ = frame_prev->timestamp();
        last_track_timestamp_[frame_prev->track_number() - 1] =
            frame_prev->timestamp();
      }

      delete frame_prev;
    }

    if (shift_left > 0) {
      if (shift_left >= frames_size_)
        return false;

      const int32_t new_frames_size = frames_size_ - shift_left;
      for (int32_t i = 0; i < new_frames_size; ++i) {
        frames_[i] = frames_[i + shift_left];
      }

      frames_size_ = new_frames_size;
    }
  }

  return true;
}